

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater.cpp
# Opt level: O3

void __thiscall
hiberlite::UpdateBean::commitRow(UpdateBean *this,shared_connection *con,sqlid_t rowid)

{
  int iVar1;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar2;
  _Elt_pointer psVar3;
  RowScope *pRVar4;
  abstract_atom *paVar5;
  _Map_pointer ppsVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  _Elt_pointer psVar10;
  logic_error *this_00;
  runtime_error *prVar11;
  char *pcVar12;
  long *plVar13;
  ulong *puVar14;
  sqlite3_stmt *psVar15;
  _Elt_pointer psVar16;
  undefined8 uVar17;
  size_t i;
  ulong uVar18;
  char *foob;
  sqlite3_stmt *stmt_ptr;
  char *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  sqlite3_stmt *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  ulong *local_b8;
  longlong *local_b0;
  ulong local_a8;
  long lStack_a0;
  string local_98;
  sqlid_t local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  psVar10 = (this->rowStack).c.
            super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_78 = rowid;
  if (psVar10 ==
      (this->rowStack).c.
      super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    if (((this->rowStack).c.
         super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].res)->res->needComma == false)
    goto LAB_00115b30;
    psVar10 = (this->rowStack).c.
              super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  else if ((psVar10[-1].res)->res->needComma == false) {
LAB_00115b30:
    std::
    deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
    ::pop_back((deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
                *)this);
    return;
  }
  if ((psVar10[-1].res)->res->id != rowid) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"rowid mismatch");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50," WHERE ","");
  plVar8 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_60 = *plVar13;
    lStack_58 = plVar8[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar13;
    local_70 = (long *)*plVar8;
  }
  local_68 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar14 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar14) {
    local_a8 = *puVar14;
    lStack_a0 = plVar8[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *puVar14;
    local_b8 = (ulong *)*plVar8;
  }
  local_b0 = (longlong *)plVar8[1];
  *plVar8 = (long)puVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  Transformer::toSQLiteValue_abi_cxx11_(&local_98,(Transformer *)&local_78,local_b0);
  uVar18 = 0xf;
  if (local_b8 != &local_a8) {
    uVar18 = local_a8;
  }
  if (uVar18 < local_98._M_string_length + (long)local_b0) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar17 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_98._M_string_length + (long)local_b0) goto LAB_00115c1a;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_00115c1a:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98._M_dataplus._M_p);
  }
  local_f8 = (char *)&local_e8;
  pcVar12 = (char *)(puVar9 + 2);
  if ((char *)*puVar9 == pcVar12) {
    local_e8 = *(undefined8 *)pcVar12;
    uStack_e0 = puVar9[3];
  }
  else {
    local_e8 = *(undefined8 *)pcVar12;
    local_f8 = (char *)*puVar9;
  }
  local_f0 = puVar9[1];
  *puVar9 = pcVar12;
  puVar9[1] = 0;
  *pcVar12 = '\0';
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar15 = (sqlite3_stmt *)(plVar8 + 2);
  if ((sqlite3_stmt *)*plVar8 == psVar15) {
    local_c8 = *(long *)psVar15;
    lStack_c0 = plVar8[3];
    local_d8 = (sqlite3_stmt *)&local_c8;
  }
  else {
    local_c8 = *(long *)psVar15;
    local_d8 = (sqlite3_stmt *)*plVar8;
  }
  local_d0 = plVar8[1];
  *plVar8 = (long)psVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  psVar10 = (this->rowStack).c.
            super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar10 ==
      (this->rowStack).c.
      super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    psVar10 = (this->rowStack).c.
              super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  std::__cxx11::string::_M_append((char *)&(psVar10[-1].res)->res->query,(ulong)local_d8);
  if (local_d8 != (sqlite3_stmt *)&local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != (char *)&local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  local_d8 = (sqlite3_stmt *)0x0;
  psVar10 = (this->rowStack).c.
            super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar10 ==
      (this->rowStack).c.
      super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    psVar10 = (this->rowStack).c.
              super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  iVar7 = sqlite3_prepare_v2(con->res->res->con,((psVar10[-1].res)->res->query)._M_dataplus._M_p,-1,
                             &local_d8,&local_f8);
  psVar2 = con->res;
  if (psVar2 == (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    if (iVar7 != 0) goto LAB_00115f75;
  }
  else {
    iVar1 = psVar2->refCount;
    psVar2->refCount = iVar1 + 1;
    if (iVar7 != 0) {
LAB_00115f75:
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      pcVar12 = sqlite3_errmsg(psVar2->res->con);
      std::runtime_error::runtime_error(prVar11,pcVar12);
      *(undefined ***)prVar11 = &PTR__runtime_error_001998c8;
      __cxa_throw(prVar11,&database_error::typeinfo,std::runtime_error::~runtime_error);
    }
    psVar2->refCount = iVar1;
    if (iVar1 == 0) {
      (*psVar2->_vptr_shared_cnt_obj_pair[1])(psVar2);
    }
  }
  puVar9 = (undefined8 *)operator_new(8);
  *puVar9 = local_d8;
  plVar8 = (long *)operator_new(0x18);
  *plVar8 = (long)&PTR__shared_cnt_obj_pair_00199998;
  plVar8[1] = (long)puVar9;
  *(undefined4 *)(plVar8 + 2) = 1;
  uVar18 = 0;
  while( true ) {
    psVar10 = (this->rowStack).c.
              super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    psVar3 = (this->rowStack).c.
             super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    psVar16 = psVar10;
    if (psVar10 == psVar3) {
      psVar16 = (this->rowStack).c.
                super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    pRVar4 = (psVar16[-1].res)->res;
    if ((ulong)((long)(pRVar4->atoms).
                      super__Vector_base<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pRVar4->atoms).
                      super__Vector_base<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar18) break;
    if (psVar10 == psVar3) {
      psVar10 = (this->rowStack).c.
                super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    paVar5 = ((psVar10[-1].res)->res->atoms).
             super__Vector_base<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar18];
    (**paVar5->_vptr_abstract_atom)(paVar5,*(undefined8 *)plVar8[1],(ulong)((int)uVar18 + 100));
    uVar18 = uVar18 + 1;
  }
  iVar7 = sqlite3_step(*(sqlite3_stmt **)plVar8[1]);
  if (iVar7 != 0x65) {
    psVar2 = con->res;
    if (psVar2 == (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      if (iVar7 != 0) goto LAB_00115feb;
    }
    else {
      iVar1 = psVar2->refCount;
      psVar2->refCount = iVar1 + 1;
      if (iVar7 != 0) {
LAB_00115feb:
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        pcVar12 = sqlite3_errmsg(psVar2->res->con);
        std::runtime_error::runtime_error(prVar11,pcVar12);
        *(undefined ***)prVar11 = &PTR__runtime_error_001998c8;
        __cxa_throw(prVar11,&database_error::typeinfo,std::runtime_error::~runtime_error);
      }
      psVar2->refCount = iVar1;
      if (iVar1 == 0) {
        (*psVar2->_vptr_shared_cnt_obj_pair[1])(psVar2);
      }
    }
  }
  ppsVar6 = (this->rowStack).c.
            super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->rowStack).c.
             super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->rowStack).c.
             super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
      ((long)(this->rowStack).c.
             super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->rowStack).c.
             super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
      ((((ulong)((long)ppsVar6 -
                (long)(this->rowStack).c.
                      super__Deque_base<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppsVar6 == (_Map_pointer)0x0)) * 0x20 == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"UpdateVisitor: commit row, but no row started");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::
  deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
  ::pop_back((deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
              *)this);
  plVar13 = plVar8 + 2;
  *(int *)plVar13 = (int)*plVar13 + -1;
  if ((int)*plVar13 == 0) {
    (**(code **)(*plVar8 + 8))(plVar8);
  }
  return;
}

Assistant:

void UpdateBean::commitRow(shared_connection con, sqlid_t rowid)
{
	if(!curRow()->needComma){
		rowStack.pop();
		return;
	}
	if(rowid!=curRow()->id)
		throw std::runtime_error("rowid mismatch");
	curRow()->query+=std::string(" WHERE ")+ HIBERLITE_PRIMARY_KEY_COLUMN + "="+ Transformer::toSQLiteValue(rowid) +";";

	sqlite3_stmt* stmt_ptr=NULL;
	{
		sqlite3* db=con->getSQLite3Ptr();
		const char* foob;
		int rc=sqlite3_prepare_v2(db,curRow()->query.c_str(),-1,&stmt_ptr,&foob);
		database_error::database_assert(rc, con);
	}
	shared_stmt statement( new statement_ptr(stmt_ptr) );

	for(size_t i=0;i<curRow()->atoms.size();i++){
		curRow()->atoms[i]->bindValue(statement->get_stmt(), static_cast<int>(i)+RowScope::FirstAtom);
	}

	{
		int rc=sqlite3_step(statement->get_stmt());
		if(rc!=SQLITE_DONE)
			database_error::database_assert(rc, con);
	}


	if(!rowStack.size())
		throw std::logic_error("UpdateVisitor: commit row, but no row started");

	rowStack.pop();
}